

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator * __thiscall
QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::iterator::
operator++(iterator *this)

{
  Chain *pCVar1;
  MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *pMVar2;
  Chain **ppCVar3;
  
  pCVar1 = *this->e;
  this->e = &pCVar1->next;
  if (pCVar1->next == (MultiNodeChain<std::shared_ptr<const_QGradientCache::CacheInfo>_> *)0x0) {
    QHashPrivate::
    iterator<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
    ::operator++(&this->i);
    if ((this->i).d ==
        (Data<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
         *)0x0) {
      ppCVar3 = (Chain **)0x0;
    }
    else {
      pMVar2 = QHashPrivate::
               iterator<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
               ::node(&this->i);
      ppCVar3 = &pMVar2->value;
    }
    this->e = ppCVar3;
  }
  return this;
}

Assistant:

inline iterator &operator++() noexcept {
            Q_ASSERT(e && *e);
            e = &(*e)->next;
            Q_ASSERT(e);
            if (!*e) {
                ++i;
                e = i.atEnd() ? nullptr : &i.node()->value;
            }
            return *this;
        }